

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  int iVar1;
  int ret;
  char *str_local;
  xmlURIPtr uri_local;
  
  if (str == (char *)0x0) {
    uri_local._4_4_ = -1;
  }
  else {
    xmlCleanURI(uri);
    iVar1 = xmlParse3986URI(uri,str);
    if (iVar1 != 0) {
      xmlCleanURI(uri);
      iVar1 = xmlParse3986RelativeRef(uri,str);
      if (iVar1 != 0) {
        xmlCleanURI(uri);
        return iVar1;
      }
    }
    uri_local._4_4_ = 0;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}